

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

UniqueIdentifier __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::GenerateUniqueId
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this)

{
  int iVar1;
  atomic<int> *paVar2;
  RenderDeviceBase<Diligent::EngineGLImplTraits> *this_local;
  
  paVar2 = &this->m_UniqueId;
  LOCK();
  iVar1 = (paVar2->super___atomic_base<int>)._M_i;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return iVar1 + 1;
}

Assistant:

UniqueIdentifier GenerateUniqueId()
    {
        return m_UniqueId.fetch_add(1) + 1;
    }